

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O3

void setsvarchecked(ident *id,char *val)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  identstack *piVar4;
  char *fmt;
  
  uVar1 = id->flags;
  if ((uVar1 & 8) != 0) {
    pcVar3 = id->name;
    fmt = "variable %s is read-only";
LAB_00127a9f:
    debugcode(fmt,pcVar3);
    return;
  }
  if ((uVar1 & 2) == 0 && (identflags & 0x10U) == 0) {
    if ((uVar1 & 0x10) != 0) {
      if ((id->field_5).stack != (identstack *)0x0) {
        operator_delete__((id->field_5).stack);
        uVar1 = id->flags;
      }
      id->flags = uVar1 & 0xffffffef;
    }
    piVar4 = *(identstack **)(id->field_4).args;
  }
  else {
    if ((uVar1 & 1) != 0) {
      pcVar3 = id->name;
      fmt = "cannot override persistent variable %s";
      goto LAB_00127a9f;
    }
    piVar4 = *(identstack **)(id->field_4).args;
    if ((uVar1 & 0x10) == 0) {
      (id->field_5).stack = piVar4;
      id->flags = uVar1 | 0x10;
      goto LAB_00127a4b;
    }
  }
  if (piVar4 != (identstack *)0x0) {
    operator_delete__(piVar4);
  }
LAB_00127a4b:
  sVar2 = strlen(val);
  pcVar3 = (char *)operator_new__(sVar2 + 1);
  strncpy(pcVar3,val,sVar2 + 1);
  pcVar3[sVar2] = '\0';
  *(char **)(id->field_4).args = pcVar3;
  if (id->fun != (identfun)0x0) {
    (*id->fun)();
    return;
  }
  return;
}

Assistant:

void setsvarchecked(ident *id, const char *val)
{
    if(id->flags&IDF_READONLY) debugcode("variable %s is read-only", id->name);
else
    {
        OVERRIDEVAR(return, id->overrideval.s = *id->storage.s, delete[] id->overrideval.s, delete[] *id->storage.s);
        *id->storage.s = newstring(val);
        id->changed();
    }
}